

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O1

LY_ERR lys_compile_identity_bases
                 (lysc_ctx *ctx,lysp_module *base_pmod,char **bases_p,lysc_ident *ident,
                 lysc_ident ***bases)

{
  long *plVar1;
  lysc_ident **pplVar2;
  lyd_node *plVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  char **ppcVar7;
  int iVar8;
  LY_ERR LVar9;
  char *pcVar10;
  lys_module *plVar11;
  undefined8 *puVar12;
  char *pcVar13;
  void *pvVar14;
  ulong uVar15;
  LY_VECODE code;
  ulong uVar16;
  long lVar17;
  ly_ctx *ctx_00;
  char *pcVar18;
  lysc_ident *plVar19;
  lysc_ident *plVar20;
  ulong uVar21;
  void *pvVar22;
  LY_ERR local_94;
  ly_set local_78;
  lysc_ident *local_60;
  lysp_module *local_58;
  ulong local_50;
  char **local_48;
  lyd_node *local_40;
  char *local_38;
  
  local_58 = base_pmod;
  if (ident == (lysc_ident *)0x0 && bases == (lysc_ident ***)0x0) {
    __assert_fail("ident || bases",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x14c,
                  "LY_ERR lys_compile_identity_bases(struct lysc_ctx *, const struct lysp_module *, const char **, struct lysc_ident *, struct lysc_ident ***)"
                 );
  }
  if (((bases_p == (char **)0x0) || (bases_p[-1] < (char *)0x2)) || (1 < ctx->pmod->version)) {
    pcVar18 = (char *)0x0;
    local_60 = ident;
    local_48 = bases_p;
LAB_001419c2:
    ppcVar7 = local_48;
    if (local_48 == (char **)0x0) {
      pcVar13 = (char *)0x0;
    }
    else {
      pcVar13 = local_48[-1];
    }
    if (pcVar13 <= pcVar18) {
      return LY_SUCCESS;
    }
    pcVar13 = local_48[(long)pcVar18];
    pcVar10 = strchr(pcVar13,0x3a);
    if (pcVar10 == (char *)0x0) {
      plVar11 = local_58->mod;
    }
    else {
      plVar11 = ly_resolve_prefix(ctx->ctx,pcVar13,(long)pcVar10 - (long)pcVar13,LY_VALUE_SCHEMA,
                                  local_58);
      pcVar13 = pcVar10 + 1;
    }
    if (plVar11 != (lys_module *)0x0) {
      plVar19 = plVar11->identities;
      lVar17 = 0;
      uVar16 = 0;
      local_38 = pcVar18;
      while( true ) {
        if (plVar19 == (lysc_ident *)0x0) {
          uVar21 = 0;
        }
        else {
          uVar21 = *(ulong *)&plVar19[-1].flags;
        }
        if (uVar21 <= uVar16) goto LAB_00141d32;
        iVar8 = strcmp(pcVar13,*(char **)((long)&plVar19->name + lVar17));
        if (iVar8 == 0) break;
        uVar16 = uVar16 + 1;
        lVar17 = lVar17 + 0x38;
      }
      if (ident == (lysc_ident *)0x0) {
        pplVar2 = *bases;
        if (pplVar2 == (lysc_ident **)0x0) {
          puVar12 = (undefined8 *)malloc(0x10);
          if (puVar12 != (undefined8 *)0x0) {
            *puVar12 = 1;
            goto LAB_00141cc1;
          }
LAB_00141cd2:
          bVar6 = false;
          local_94 = LY_EMEM;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_identity_bases");
        }
        else {
          plVar19 = pplVar2[-1];
          pplVar2[-1] = (lysc_ident *)((long)&plVar19->name + 1);
          puVar12 = (undefined8 *)realloc(pplVar2 + -1,(long)plVar19 * 8 + 0x10);
          if (puVar12 == (undefined8 *)0x0) {
            (*bases)[-1] = (lysc_ident *)&(*bases)[-1][-1].field_0x37;
            goto LAB_00141cd2;
          }
LAB_00141cc1:
          *bases = (lysc_ident **)(puVar12 + 1);
          bVar6 = true;
        }
        if (!bVar6) {
          return local_94;
        }
        pplVar2 = *bases;
        plVar19 = pplVar2[-1];
        pplVar2[(long)&plVar19[-1].field_0x37] = (lysc_ident *)0x0;
        pplVar2[(long)&plVar19[-1].field_0x37] =
             (lysc_ident *)((long)&plVar11->identities->name + lVar17);
        ident = local_60;
        goto LAB_00141d32;
      }
      plVar19 = (lysc_ident *)((long)&plVar19->name + lVar17);
      if (plVar19 != ident) {
        pplVar2 = ident->derived;
        local_78.size = 0;
        local_78.count = 0;
        local_78.field_2.dnodes = (lyd_node **)0x0;
        if (pplVar2 != (lysc_ident **)0x0) {
          if (pplVar2[-1] != (lysc_ident *)0x0) {
            plVar20 = (lysc_ident *)0x0;
            do {
              if (plVar19 == pplVar2[(long)plVar20]) goto LAB_00141b8f;
              LVar9 = ly_set_add(&local_78,pplVar2[(long)plVar20],'\0',(uint32_t *)0x0);
              if (LVar9 != LY_SUCCESS) goto LAB_00141bbb;
              plVar20 = (lysc_ident *)((long)&plVar20->name + 1);
            } while (plVar20 < pplVar2[-1]);
          }
          LVar9 = LY_SUCCESS;
          if (local_78.count != 0) {
            uVar15 = 0;
            do {
              local_40 = local_78.field_2.dnodes[uVar15];
              pvVar22 = (void *)0x0;
              local_50 = uVar15;
              while( true ) {
                plVar3 = local_40->prev;
                if (plVar3 == (lyd_node *)0x0) {
                  pvVar14 = (void *)0x0;
                }
                else {
                  pvVar14 = plVar3[-1].priv;
                }
                if (pvVar14 <= pvVar22) break;
                if (plVar19 == *(lysc_ident **)(&plVar3->hash + (long)pvVar22 * 2))
                goto LAB_00141b8f;
                LVar9 = ly_set_add(&local_78,*(lysc_ident **)(&plVar3->hash + (long)pvVar22 * 2),
                                   '\0',(uint32_t *)0x0);
                pvVar22 = (void *)((long)pvVar22 + 1);
                if (LVar9 != LY_SUCCESS) goto LAB_00141bbb;
              }
              uVar15 = local_50 + 1;
              LVar9 = LY_SUCCESS;
            } while (uVar15 < (ulong)local_78._0_8_ >> 0x20);
          }
          goto LAB_00141bbb;
        }
        LVar9 = LY_SUCCESS;
        goto LAB_00141bc7;
      }
      ctx_00 = ctx->ctx;
      pcVar18 = ident->name;
      pcVar13 = "Identity \"%s\" is derived from itself.";
      code = LYVE_REFERENCE;
      goto LAB_00141db2;
    }
    ctx_00 = ctx->ctx;
    pcVar18 = ppcVar7[(long)pcVar18];
    if (ident != (lysc_ident *)0x0) {
      pcVar13 = ident->name;
      pcVar10 = "Invalid prefix used for base (%s) of identity \"%s\".";
      goto LAB_00141d85;
    }
    pcVar13 = "Invalid prefix used for base (%s) of identityref.";
    goto LAB_00141dab;
  }
  ctx_00 = ctx->ctx;
  pcVar18 = "identityref type";
  if (ident != (lysc_ident *)0x0) {
    pcVar18 = "identity";
  }
  pcVar13 = "Multiple bases in %s are allowed only in YANG 1.1 modules.";
LAB_00141dab:
  code = LYVE_SYNTAX_YANG;
LAB_00141db2:
  ly_vlog(ctx_00,(char *)0x0,code,pcVar13,pcVar18);
  return LY_EVALID;
LAB_00141b8f:
  ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,"Identity \"%s\" is indirectly derived from itself.",
          plVar19->name);
  LVar9 = LY_EVALID;
LAB_00141bbb:
  ly_set_erase(&local_78,(_func_void_void_ptr *)0x0);
LAB_00141bc7:
  if (LVar9 != LY_SUCCESS) {
    return LVar9;
  }
  lVar4 = *(long *)((long)&plVar11->identities->derived + lVar17);
  if (lVar4 == 0) {
    puVar12 = (undefined8 *)malloc(0x10);
    if (puVar12 != (undefined8 *)0x0) {
      *puVar12 = 1;
      goto LAB_00141c3b;
    }
  }
  else {
    lVar5 = *(long *)(lVar4 + -8);
    *(long *)(lVar4 + -8) = lVar5 + 1;
    puVar12 = (undefined8 *)realloc((void *)(lVar4 + -8),lVar5 * 8 + 0x10);
    if (puVar12 != (undefined8 *)0x0) {
LAB_00141c3b:
      *(undefined8 **)((long)&plVar11->identities->derived + lVar17) = puVar12 + 1;
      bVar6 = true;
      goto LAB_00141c81;
    }
    plVar1 = (long *)(*(long *)((long)&plVar11->identities->derived + lVar17) + -8);
    *plVar1 = *plVar1 + -1;
  }
  bVar6 = false;
  local_94 = LY_EMEM;
  ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_identity_bases");
LAB_00141c81:
  if (!bVar6) {
    return local_94;
  }
  lVar17 = *(long *)((long)&plVar11->identities->derived + lVar17);
  *(lysc_ident **)(lVar17 + -8 + *(long *)(lVar17 + -8) * 8) = local_60;
  ident = local_60;
LAB_00141d32:
  if (uVar21 <= uVar16) goto LAB_00141d6a;
  pcVar18 = local_38 + 1;
  goto LAB_001419c2;
LAB_00141d6a:
  ctx_00 = ctx->ctx;
  pcVar18 = local_48[(long)local_38];
  if (ident != (lysc_ident *)0x0) {
    pcVar13 = ident->name;
    pcVar10 = "Unable to find base (%s) of identity \"%s\".";
LAB_00141d85:
    ly_vlog(ctx_00,(char *)0x0,LYVE_SYNTAX_YANG,pcVar10,pcVar18,pcVar13);
    return LY_EVALID;
  }
  pcVar13 = "Unable to find base (%s) of identityref.";
  goto LAB_00141dab;
}

Assistant:

LY_ERR
lys_compile_identity_bases(struct lysc_ctx *ctx, const struct lysp_module *base_pmod, const char **bases_p,
        struct lysc_ident *ident, struct lysc_ident ***bases)
{
    LY_ARRAY_COUNT_TYPE u, v;
    const char *s, *name;
    const struct lys_module *mod;
    struct lysc_ident **idref;

    assert(ident || bases);

    if ((LY_ARRAY_COUNT(bases_p) > 1) && (ctx->pmod->version < LYS_VERSION_1_1)) {
        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                "Multiple bases in %s are allowed only in YANG 1.1 modules.", ident ? "identity" : "identityref type");
        return LY_EVALID;
    }

    LY_ARRAY_FOR(bases_p, u) {
        s = strchr(bases_p[u], ':');
        if (s) {
            /* prefixed identity */
            name = &s[1];
            mod = ly_resolve_prefix(ctx->ctx, bases_p[u], s - bases_p[u], LY_VALUE_SCHEMA, (void *)base_pmod);
        } else {
            name = bases_p[u];
            mod = base_pmod->mod;
        }
        if (!mod) {
            if (ident) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid prefix used for base (%s) of identity \"%s\".", bases_p[u], ident->name);
            } else {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid prefix used for base (%s) of identityref.", bases_p[u]);
            }
            return LY_EVALID;
        }

        idref = NULL;
        LY_ARRAY_FOR(mod->identities, v) {
            if (!strcmp(name, mod->identities[v].name)) {
                if (ident) {
                    if (ident == &mod->identities[v]) {
                        LOGVAL(ctx->ctx, LYVE_REFERENCE,
                                "Identity \"%s\" is derived from itself.", ident->name);
                        return LY_EVALID;
                    }
                    LY_CHECK_RET(lys_compile_identity_circular_check(ctx, &mod->identities[v], ident->derived));
                    /* we have match! store the backlink */
                    LY_ARRAY_NEW_RET(ctx->ctx, mod->identities[v].derived, idref, LY_EMEM);
                    *idref = ident;
                } else {
                    /* we have match! store the found identity */
                    LY_ARRAY_NEW_RET(ctx->ctx, *bases, idref, LY_EMEM);
                    *idref = &mod->identities[v];
                }
                break;
            }
        }
        if (!idref) {
            if (ident) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Unable to find base (%s) of identity \"%s\".", bases_p[u], ident->name);
            } else {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Unable to find base (%s) of identityref.", bases_p[u]);
            }
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}